

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O0

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::NewActiveCornerReached
          (MeshEdgebreakerTraversalPredictiveDecoder *this,CornerIndex corner)

{
  uint uVar1;
  vector<int,_std::allocator<int>_> *pvVar2;
  reference pvVar3;
  undefined4 in_ESI;
  long in_RDI;
  VertexIndex pivot;
  CornerIndex prev;
  CornerIndex next;
  CornerTable *in_stack_ffffffffffffff08;
  CornerIndex in_stack_ffffffffffffff10;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_7c;
  uint local_78;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_74;
  uint local_70;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_6c;
  undefined4 local_68;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_64;
  uint local_60;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_5c;
  uint local_58;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_54;
  undefined4 local_50;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_4c;
  uint local_48;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_44;
  uint local_40;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_3c;
  undefined4 local_38;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_34;
  uint local_30;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_2c;
  uint local_28;
  IndexType<unsigned_int,_draco::VertexIndex_tag_type_> local_24;
  undefined4 local_20;
  uint local_1c;
  uint local_14;
  undefined4 local_4;
  
  local_4 = in_ESI;
  local_14 = (uint)CornerTable::Next(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  local_20 = local_4;
  local_1c = (uint)CornerTable::Previous(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
  switch(*(undefined4 *)(in_RDI + 0x118)) {
  case 0:
  case 1:
    local_28 = local_14;
    local_24.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_24);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    local_30 = local_1c;
    local_2c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_2c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    break;
  default:
    break;
  case 3:
    local_50 = local_4;
    local_4c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_4c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    local_58 = local_14;
    local_54.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_54);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 2;
    local_60 = local_1c;
    local_5c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_5c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    break;
  case 5:
    local_38 = local_4;
    local_34.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_34);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    local_40 = local_14;
    local_3c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_3c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 1;
    local_48 = local_1c;
    local_44.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_44);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 2;
    break;
  case 7:
    pvVar2 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8);
    local_68 = local_4;
    local_64.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,(uint)pvVar2);
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_64);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)uVar1);
    *pvVar3 = *pvVar3 + 2;
    local_70 = local_14;
    in_stack_ffffffffffffff10.value_ = (uint)pvVar2;
    local_6c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_6c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 2;
    local_78 = local_1c;
    local_74.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_74);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8),(ulong)uVar1);
    *pvVar3 = *pvVar3 + 2;
  }
  if ((*(int *)(in_RDI + 0x118) == 0) || (*(int *)(in_RDI + 0x118) == 5)) {
    CornerTable::Next(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
    local_7c.value_ = (uint)CornerTable::Vertex(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10)
    ;
    pvVar2 = (vector<int,_std::allocator<int>_> *)(in_RDI + 0xe8);
    uVar1 = IndexType<unsigned_int,_draco::VertexIndex_tag_type_>::value(&local_7c);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](pvVar2,(ulong)uVar1);
    if (*pvVar3 < 6) {
      *(undefined4 *)(in_RDI + 0x11c) = 5;
    }
    else {
      *(undefined4 *)(in_RDI + 0x11c) = 0;
    }
  }
  else {
    *(undefined4 *)(in_RDI + 0x11c) = 0xffffffff;
  }
  return;
}

Assistant:

inline void NewActiveCornerReached(CornerIndex corner) {
    const CornerIndex next = corner_table_->Next(corner);
    const CornerIndex prev = corner_table_->Previous(corner);
    // Update valences.
    switch (last_symbol_) {
      case TOPOLOGY_C:
      case TOPOLOGY_S:
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_R:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 1;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      case TOPOLOGY_L:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 1;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 1;
        break;
      case TOPOLOGY_E:
        vertex_valences_[corner_table_->Vertex(corner).value()] += 2;
        vertex_valences_[corner_table_->Vertex(next).value()] += 2;
        vertex_valences_[corner_table_->Vertex(prev).value()] += 2;
        break;
      default:
        break;
    }
    // Compute the new predicted symbol.
    if (last_symbol_ == TOPOLOGY_C || last_symbol_ == TOPOLOGY_R) {
      const VertexIndex pivot =
          corner_table_->Vertex(corner_table_->Next(corner));
      if (vertex_valences_[pivot.value()] < 6) {
        predicted_symbol_ = TOPOLOGY_R;
      } else {
        predicted_symbol_ = TOPOLOGY_C;
      }
    } else {
      predicted_symbol_ = -1;
    }
  }